

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O1

void __thiscall beast::Journal::ScopedStream::~ScopedStream(ScopedStream *this)

{
  Severity SVar1;
  Sink *pSVar2;
  int iVar3;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::stringbuf::str();
  if (local_60 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    pSVar2 = this->m_sink;
    SVar1 = this->m_level;
    if (iVar3 == 0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
      (*pSVar2->_vptr_Sink[7])(pSVar2,(ulong)SVar1,local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    else {
      (*pSVar2->_vptr_Sink[7])(pSVar2,(ulong)SVar1,&local_68);
    }
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_ostream);
  std::ios_base::~ios_base((ios_base *)&this->field_0x80);
  return;
}

Assistant:

Journal::ScopedStream::~ScopedStream ()
{
    std::string const& s (m_ostream.str());
    if (! s.empty ())
    {
        if (s == "\n")
            m_sink.write (m_level, "");
        else
            m_sink.write (m_level, s);
    }
}